

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

Vector<double,_4> * __thiscall
tcu::faceForward<double,4>
          (Vector<double,_4> *__return_storage_ptr__,tcu *this,Vector<double,_4> *n,
          Vector<double,_4> *i,Vector<double,_4> *ref)

{
  Vector<double,_4> *a;
  double dVar1;
  Vector<double,_4> *ref_local;
  Vector<double,_4> *i_local;
  Vector<double,_4> *n_local;
  
  dVar1 = dot<double,4>(i,n);
  if (0.0 <= dVar1) {
    operator-(__return_storage_ptr__,this,a);
  }
  else {
    Vector<double,_4>::Vector(__return_storage_ptr__,(Vector<double,_4> *)this);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Vector<T, Size> faceForward (const Vector<T, Size>& n, const Vector<T, Size>& i, const Vector<T, Size>& ref)
{
	return (dot(ref, i) < T(0)) ? n: -n;
}